

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void pobr::utils::Logger::error(string *message,bool *noThrow)

{
  Exception *this;
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,"Error",&local_52);
  std::__cxx11::string::string((string *)&local_30,"red",&local_51);
  TerminalPrinter::printLabel(&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"Error",&local_52);
  local_30._M_dataplus._M_p._0_4_ = TerminalPrinter::getLabelLength(&local_50);
  print((uint *)&local_30,message);
  std::__cxx11::string::~string((string *)&local_50);
  if (*noThrow == true) {
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  Exception::Exception(this,message);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Logger::error(const std::string& message, const bool& noThrow)
{
    Logger::printLabel("Error", "red");
    Logger::print(Logger::getLabelLength("Error"), message);

    if (noThrow)
    {
        return;
    }

    throw Logger::Exception(message);
}